

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbMan.c
# Opt level: O2

void Rsb_ManFree(Rsb_Man_t *p)

{
  Vec_Wrd_t *__ptr;
  
  __ptr = p->vCexes;
  free(__ptr->pArray);
  free(__ptr);
  Vec_IntFree(p->vDecPats);
  Vec_IntFree(p->vFanins);
  Vec_IntFree(p->vFaninsOld);
  Vec_IntFree(p->vTries);
  free(p);
  return;
}

Assistant:

void Rsb_ManFree( Rsb_Man_t * p )
{
    Vec_WrdFree( p->vCexes );
    Vec_IntFree( p->vDecPats );
    Vec_IntFree( p->vFanins );
    Vec_IntFree( p->vFaninsOld );
    Vec_IntFree( p->vTries );
    ABC_FREE( p );
}